

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-tree.c
# Opt level: O0

coda_tree_node * coda_tree_node_new(coda_type *root_type)

{
  coda_tree_node *node;
  coda_type *root_type_local;
  
  root_type_local = (coda_type *)malloc(0x38);
  if (root_type_local == (coda_type *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x38,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-tree.c"
                   ,0x35);
    root_type_local = (coda_type *)0x0;
  }
  else {
    *(coda_type **)root_type_local = root_type;
    root_type_local->type_class = coda_record_class;
    root_type_local->name = (char *)0x0;
    root_type_local->description = (char *)0x0;
    *(undefined4 *)&root_type_local->bit_size = 0;
    root_type_local->size_expr = (coda_expression *)0x0;
    root_type_local->attributes = (coda_type_record *)0x0;
  }
  return (coda_tree_node *)root_type_local;
}

Assistant:

coda_tree_node *coda_tree_node_new(const coda_type *root_type)
{
    coda_tree_node *node;

    node = malloc(sizeof(coda_tree_node));
    if (node == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_tree_node), __FILE__, __LINE__);
        return NULL;
    }
    node->type = root_type;
    node->num_items = 0;
    node->item = NULL;
    node->all_children = NULL;
    node->num_indexed_children = 0;
    node->index = NULL;
    node->indexed_child = NULL;

    return node;
}